

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_converter.cpp
# Opt level: O3

void dxil_spv::propagate_precise
               (UnorderedSet<const_LLVMBC::Instruction_*> *cache,Instruction *value)

{
  ValueKind VVar1;
  uint uVar2;
  const_iterator cVar3;
  PHINode *this;
  Value *pVVar4;
  __hashtable *__h;
  uint uVar5;
  __node_gen_type __node_gen;
  Instruction *local_30;
  UnorderedSet<const_LLVMBC::Instruction_*> *local_28;
  
  local_30 = value;
  cVar3 = std::
          _Hashtable<const_LLVMBC::Instruction_*,_const_LLVMBC::Instruction_*,_dxil_spv::ThreadLocalAllocator<const_LLVMBC::Instruction_*>,_std::__detail::_Identity,_std::equal_to<const_LLVMBC::Instruction_*>,_std::hash<const_LLVMBC::Instruction_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
          ::find(&cache->_M_h,&local_30);
  if (cVar3.super__Node_iterator_base<const_LLVMBC::Instruction_*,_false>._M_cur ==
      (__node_type *)0x0) {
    local_28 = cache;
    std::
    _Hashtable<LLVMBC::Instruction_const*,LLVMBC::Instruction_const*,dxil_spv::ThreadLocalAllocator<LLVMBC::Instruction_const*>,std::__detail::_Identity,std::equal_to<LLVMBC::Instruction_const*>,std::hash<LLVMBC::Instruction_const*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
    ::
    _M_insert<LLVMBC::Instruction_const*const&,std::__detail::_AllocNode<dxil_spv::ThreadLocalAllocator<std::__detail::_Hash_node<LLVMBC::Instruction_const*,false>>>>
              ((_Hashtable<LLVMBC::Instruction_const*,LLVMBC::Instruction_const*,dxil_spv::ThreadLocalAllocator<LLVMBC::Instruction_const*>,std::__detail::_Identity,std::equal_to<LLVMBC::Instruction_const*>,std::hash<LLVMBC::Instruction_const*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                *)cache,&local_30);
    this = (PHINode *)LLVMBC::Internal::resolve_proxy(&local_30->super_Value);
    VVar1 = LLVMBC::Value::get_value_kind((Value *)this);
    if (VVar1 == PHI) {
      uVar2 = LLVMBC::PHINode::getNumIncomingValues(this);
      if (uVar2 != 0) {
        uVar5 = 0;
        do {
          pVVar4 = LLVMBC::PHINode::getIncomingValue(this,uVar5);
          mark_precise(cache,pVVar4);
          uVar5 = uVar5 + 1;
        } while (uVar2 != uVar5);
      }
    }
    else {
      uVar2 = LLVMBC::Instruction::getNumOperands(local_30);
      if (uVar2 != 0) {
        uVar5 = 0;
        do {
          pVVar4 = LLVMBC::Instruction::getOperand(local_30,uVar5);
          mark_precise(cache,pVVar4);
          uVar5 = uVar5 + 1;
        } while (uVar2 != uVar5);
      }
    }
  }
  return;
}

Assistant:

static void propagate_precise(UnorderedSet<const llvm::Instruction *> &cache, const llvm::Instruction *value)
{
	if (cache.count(value) != 0)
		return;
	cache.insert(value);

	if (const auto *phi = llvm::dyn_cast<llvm::PHINode>(value))
	{
		for (unsigned i = 0, n = phi->getNumIncomingValues(); i < n; i++)
			mark_precise(cache, phi->getIncomingValue(i));
	}
	else
	{
		for (unsigned i = 0, n = value->getNumOperands(); i < n; i++)
			mark_precise(cache, value->getOperand(i));
	}
}